

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O1

bool sect_IsSizeKnown(Section *sect)

{
  int iVar1;
  SectionStackEntry *pSVar2;
  bool bVar3;
  
  if (sect->modifier == SECTION_NORMAL) {
    bVar3 = false;
    if ((currentSection != sect) && (pSVar2 = sectionStack, currentLoadSection != sect)) {
      while ((bVar3 = pSVar2 == (SectionStackEntry *)0x0, !bVar3 &&
             ((pSVar2->section == (Section *)0x0 ||
              (iVar1 = strcmp(sect->name,pSVar2->section->name), iVar1 != 0))))) {
        pSVar2 = pSVar2->next;
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool sect_IsSizeKnown(struct Section const NONNULL(sect))
{
	// SECTION UNION and SECTION FRAGMENT can still grow
	if (sect->modifier != SECTION_NORMAL)
		return false;

	// The current section (or current load section if within one) is still growing
	if (sect == currentSection || sect == currentLoadSection)
		return false;

	// Any section on the stack is still growing
	for (struct SectionStackEntry *stack = sectionStack; stack; stack = stack->next) {
		if (stack->section && !strcmp(sect->name, stack->section->name))
			return false;
	}

	return true;
}